

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O0

uint32_t __thiscall Cache::getAddr(Cache *this,Block *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long in_RSI;
  Cache *in_RDI;
  uint32_t idBits;
  uint32_t offsetBits;
  
  uVar1 = log2i(in_RDI,(in_RDI->policy).blockSize);
  uVar2 = log2i(in_RDI,(in_RDI->policy).blockNum / (in_RDI->policy).associativity);
  return *(int *)(in_RSI + 4) << ((byte)uVar1 + (char)uVar2 & 0x1f) |
         *(int *)(in_RSI + 8) << ((byte)uVar1 & 0x1f);
}

Assistant:

uint32_t Cache::getAddr(Cache::Block &b) {
  uint32_t offsetBits = log2i(policy.blockSize);
  uint32_t idBits = log2i(policy.blockNum / policy.associativity);
  return (b.tag << (offsetBits + idBits)) | (b.id << offsetBits);
}